

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall
cmGeneratorTarget::GetInstallNameDirForInstallTree_abi_cxx11_
          (string *__return_storage_ptr__,cmGeneratorTarget *this)

{
  cmMakefile *this_00;
  bool bVar1;
  char *pcVar2;
  allocator local_41;
  string local_40;
  
  this_00 = this->Makefile;
  std::__cxx11::string::string((string *)&local_40,"CMAKE_PLATFORM_HAS_INSTALLNAME",&local_41);
  bVar1 = cmMakefile::IsOn(this_00,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (bVar1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::string((string *)&local_40,"INSTALL_NAME_DIR",&local_41);
    pcVar2 = GetProperty(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    bVar1 = CanGenerateInstallNameDir(this,INSTALL_NAME_FOR_INSTALL);
    if (bVar1 && pcVar2 != (char *)0x0) {
      if (*pcVar2 != '\0') {
        std::__cxx11::string::assign((char *)__return_storage_ptr__);
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
    }
    else if (pcVar2 == (char *)0x0) {
      bVar1 = MacOSXRpathInstallNameDirDefault(this);
      if (bVar1) {
        std::__cxx11::string::assign((char *)__return_storage_ptr__);
      }
    }
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetInstallNameDirForInstallTree() const
{
  if (this->Makefile->IsOn("CMAKE_PLATFORM_HAS_INSTALLNAME")) {
    std::string dir;
    const char* install_name_dir = this->GetProperty("INSTALL_NAME_DIR");

    if (this->CanGenerateInstallNameDir(INSTALL_NAME_FOR_INSTALL)) {
      if (install_name_dir && *install_name_dir) {
        dir = install_name_dir;
        dir += "/";
      }
    }
    if (!install_name_dir) {
      if (this->MacOSXRpathInstallNameDirDefault()) {
        dir = "@rpath/";
      }
    }
    return dir;
  }
  return "";
}